

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clmul_1byte.cpp
# Opt level: O1

Sketch * ConstructClMulTri1Byte(int bits,int implementation)

{
  long in_FS_OFFSET;
  
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return (Sketch *)0x0;
  }
  __stack_chk_fail();
}

Assistant:

Sketch* ConstructClMulTri1Byte(int bits, int implementation) {
    switch (bits) {
#ifdef ENABLE_FIELD_INT_2
    case 2: return new SketchImpl<FieldTri2>(implementation, 2);
#endif
#ifdef ENABLE_FIELD_INT_3
    case 3: return new SketchImpl<FieldTri3>(implementation, 3);
#endif
#ifdef ENABLE_FIELD_INT_4
    case 4: return new SketchImpl<FieldTri4>(implementation, 4);
#endif
#ifdef ENABLE_FIELD_INT_5
    case 5: return new SketchImpl<FieldTri5>(implementation, 5);
#endif
#ifdef ENABLE_FIELD_INT_6
    case 6: return new SketchImpl<FieldTri6>(implementation, 6);
#endif
#ifdef ENABLE_FIELD_INT_7
    case 7: return new SketchImpl<FieldTri7>(implementation, 7);
#endif
    }
    return nullptr;
}